

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O0

void device_reset_qsound(void *info)

{
  UINT32 MuteMask;
  undefined4 local_20;
  int adr;
  UINT32 muteMask;
  qsound_state *chip;
  void *info_local;
  
  MuteMask = qsound_get_mute_mask(info);
  memset((void *)((long)info + 8),0,0x240);
  qsound_set_mute_mask(info,MuteMask);
  for (local_20 = 0x7f; -1 < local_20; local_20 = local_20 + -1) {
    qsound_write_data(info,(UINT8)local_20,0);
  }
  for (local_20 = 0x80; local_20 < 0x90; local_20 = local_20 + 1) {
    qsound_write_data(info,(UINT8)local_20,0x120);
  }
  return;
}

Assistant:

static void device_reset_qsound(void *info)
{
	qsound_state *chip = (qsound_state *)info;
	UINT32 muteMask;
	int adr;

	muteMask = qsound_get_mute_mask(chip);
	// init sound regs
	memset(chip->channel, 0, sizeof(chip->channel));
	qsound_set_mute_mask(chip, muteMask);

	for (adr = 0x7f; adr >= 0; adr--)
		qsound_write_data(chip, adr, 0);
	for (adr = 0x80; adr < 0x90; adr++)
		qsound_write_data(chip, adr, 0x120);

	return;
}